

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O3

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  char *__end;
  bool bVar4;
  undefined1 *local_50;
  string *local_48;
  undefined1 local_40 [16];
  
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)ifile + -0x18) + (char)ifile);
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)ifile,(string *)line,cVar1);
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    do {
      limonp::Trim(line);
      if (line->_M_string_length != 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#","");
        if ((string *)line->_M_string_length < local_48) {
          bVar4 = false;
        }
        else {
          iVar2 = std::__cxx11::string::compare((ulong)line,0,local_48);
          bVar4 = iVar2 == 0;
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (!bVar4) {
          return true;
        }
      }
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)ifile + -0x18) + (char)ifile);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)ifile,(string *)line,cVar1);
    } while (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0);
  }
  return false;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }